

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O2

void __thiscall TEST_SimpleString_AtoU_Test::testBody(TEST_SimpleString_AtoU_Test *this)

{
  uint uVar1;
  undefined8 in_RAX;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  char max_short_str [6];
  undefined2 uStack_32;
  
  _max_short_str = CONCAT26((short)((ulong)in_RAX >> 0x30),0x3500000000);
  _max_short_str = CONCAT44(stack0xffffffffffffffcc,0x33353536);
  pUVar2 = UtestShell::getCurrent();
  uVar1 = SimpleString::AtoU("012345");
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar1 == 0x3039),"CHECK","12345 == SimpleString::AtoU(\"012345\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x42c,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  uVar1 = SimpleString::AtoU("6789");
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar1 == 0x1a85),"CHECK","6789 == SimpleString::AtoU(\"6789\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x42d,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  uVar1 = SimpleString::AtoU("12345/");
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar1 == 0x3039),"CHECK","12345 == SimpleString::AtoU(\"12345/\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x42e,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  uVar1 = SimpleString::AtoU("12345:");
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar1 == 0x3039),"CHECK","12345 == SimpleString::AtoU(\"12345:\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x42f,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  uVar1 = SimpleString::AtoU("\t \r\n123");
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar1 == 0x7b),"CHECK","123 == SimpleString::AtoU(\"\\t \\r\\n123\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x430,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  uVar1 = SimpleString::AtoU("123-foo");
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar1 == 0x7b),"CHECK","123 == SimpleString::AtoU(\"123-foo\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x431,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  uVar1 = SimpleString::AtoU(max_short_str);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar1 == 0xffff),"CHECK","65535 == SimpleString::AtoU(max_short_str)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x432,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  uVar1 = SimpleString::AtoU("foo");
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar1 == 0),"CHECK","0 == SimpleString::AtoU(\"foo\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x433,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  uVar1 = SimpleString::AtoU("-foo");
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar1 == 0),"CHECK","0 == SimpleString::AtoU(\"-foo\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x434,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  uVar1 = SimpleString::AtoU("+1");
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar1 == 0),"CHECK","0 == SimpleString::AtoU(\"+1\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x435,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  uVar1 = SimpleString::AtoU("-1");
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar1 == 0),"CHECK","0 == SimpleString::AtoU(\"-1\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x436,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  uVar1 = SimpleString::AtoU("0");
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar1 == 0),"CHECK","0 == SimpleString::AtoU(\"0\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x437,pTVar3);
  return;
}

Assistant:

TEST(SimpleString, AtoU)
{
    char max_short_str[] = "65535";
    CHECK(12345  == SimpleString::AtoU("012345"));
    CHECK(6789   == SimpleString::AtoU("6789"));
    CHECK(12345  == SimpleString::AtoU("12345/"));
    CHECK(12345  == SimpleString::AtoU("12345:"));
    CHECK(123    == SimpleString::AtoU("\t \r\n123"));
    CHECK(123    == SimpleString::AtoU("123-foo"));
    CHECK(65535  == SimpleString::AtoU(max_short_str));
    CHECK(0      == SimpleString::AtoU("foo"));
    CHECK(0      == SimpleString::AtoU("-foo"));
    CHECK(0      == SimpleString::AtoU("+1"));
    CHECK(0      == SimpleString::AtoU("-1"));
    CHECK(0      == SimpleString::AtoU("0"));
}